

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O2

ConfidentialTransactionController * __thiscall
cfd::api::ElementsTransactionApi::UnblindTransaction
          (ConfidentialTransactionController *__return_storage_ptr__,ElementsTransactionApi *this,
          string *tx_hex,
          vector<cfd::api::TxOutUnblindKeys,_std::allocator<cfd::api::TxOutUnblindKeys>_>
          *txout_unblind_keys,
          vector<cfd::api::IssuanceBlindKeys,_std::allocator<cfd::api::IssuanceBlindKeys>_>
          *issuance_blind_keys,
          vector<cfd::api::UnblindOutputs,_std::allocator<cfd::api::UnblindOutputs>_> *blind_outputs
          ,vector<cfd::api::UnblindIssuanceOutputs,_std::allocator<cfd::api::UnblindIssuanceOutputs>_>
           *issuance_outputs)

{
  UnblindParameter *this_00;
  uint32_t *puVar1;
  Txid *pTVar2;
  undefined8 uVar3;
  uint32_t tx_in_index;
  ConfidentialTransaction *pCVar4;
  Txid *object;
  uint32_t *puVar5;
  UnblindParameter unblind_param;
  UnblindOutputs output;
  Privkey_conflict blinding_key;
  UnblindParameter local_1a8;
  undefined1 local_118 [32];
  uint32_t local_f8;
  undefined1 local_f0 [40];
  undefined1 local_c8 [40];
  ConfidentialAssetId local_a0;
  ConfidentialValue local_78;
  Privkey local_50;
  
  ConfidentialTransactionController::ConfidentialTransactionController
            (__return_storage_ptr__,tx_hex);
  if ((blind_outputs !=
       (vector<cfd::api::UnblindOutputs,_std::allocator<cfd::api::UnblindOutputs>_> *)0x0) &&
     (*(long *)txout_unblind_keys != *(long *)(txout_unblind_keys + 8))) {
    core::UnblindParameter::UnblindParameter(&local_1a8);
    puVar1 = *(uint32_t **)(txout_unblind_keys + 8);
    for (puVar5 = *(uint32_t **)txout_unblind_keys; puVar5 != puVar1; puVar5 = puVar5 + 10) {
      core::Privkey::Privkey(&local_50,(Privkey *)(puVar5 + 2));
      ConfidentialTransactionController::UnblindTxOut
                ((UnblindParameter *)local_118,__return_storage_ptr__,*puVar5,&local_50);
      core::UnblindParameter::operator=(&local_1a8,(UnblindParameter *)local_118);
      core::UnblindParameter::~UnblindParameter((UnblindParameter *)local_118);
      core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_118,&local_1a8.asset);
      uVar3 = local_118._8_8_;
      std::__cxx11::string::~string((string *)local_118);
      if ((_func_int **)uVar3 != (_func_int **)0x0) {
        this_00 = (UnblindParameter *)(local_118 + 8);
        core::UnblindParameter::UnblindParameter(this_00);
        local_118._0_4_ = *puVar5;
        core::ConfidentialAssetId::operator=((ConfidentialAssetId *)this_00,&local_1a8.asset);
        core::BlindFactor::operator=((BlindFactor *)local_c8,&local_1a8.vbf);
        core::BlindFactor::operator=((BlindFactor *)(local_f0 + 8),&local_1a8.abf);
        core::ConfidentialValue::operator=((ConfidentialValue *)(local_c8 + 0x20),&local_1a8.value);
        std::vector<cfd::api::UnblindOutputs,_std::allocator<cfd::api::UnblindOutputs>_>::push_back
                  (blind_outputs,(value_type *)local_118);
        core::UnblindParameter::~UnblindParameter(this_00);
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50);
    }
    core::UnblindParameter::~UnblindParameter(&local_1a8);
  }
  object = *(Txid **)issuance_blind_keys;
  pTVar2 = *(Txid **)(issuance_blind_keys + 8);
  if (issuance_outputs !=
      (vector<cfd::api::UnblindIssuanceOutputs,_std::allocator<cfd::api::UnblindIssuanceOutputs>_> *
      )0x0 && object != pTVar2) {
    for (; object != pTVar2; object = (Txid *)&object[3].data_) {
      pCVar4 = ConfidentialTransactionController::GetTransaction(__return_storage_ptr__);
      core::Txid::Txid((Txid *)local_118,object);
      tx_in_index = (*(pCVar4->super_AbstractTransaction)._vptr_AbstractTransaction[2])
                              (pCVar4,(UnblindIssuanceOutputs *)local_118,
                               (ulong)*(uint *)&object[1]._vptr_Txid);
      core::Txid::~Txid((Txid *)local_118);
      ConfidentialTransactionController::UnblindIssuance
                ((vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
                  *)&local_1a8,__return_storage_ptr__,tx_in_index,(Privkey *)&object[1].data_,
                 (Privkey *)&object[2].data_);
      UnblindIssuanceOutputs::UnblindIssuanceOutputs((UnblindIssuanceOutputs *)local_118);
      core::Txid::operator=((Txid *)local_118,object);
      local_f8 = *(uint32_t *)&object[1]._vptr_Txid;
      core::ConfidentialAssetId::operator=
                ((ConfidentialAssetId *)local_f0,
                 (ConfidentialAssetId *)local_1a8.asset._vptr_ConfidentialAssetId);
      core::ConfidentialValue::operator=
                ((ConfidentialValue *)local_c8,
                 (ConfidentialValue *)
                 &(((ConfidentialAssetId *)((long)local_1a8.asset._vptr_ConfidentialAssetId + 0x50))
                  ->data_).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (1 < (ulong)(((long)local_1a8.asset.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start -
                      (long)local_1a8.asset._vptr_ConfidentialAssetId) / 0x90)) {
        core::ConfidentialAssetId::operator=
                  (&local_a0,
                   (ConfidentialAssetId *)
                   &(((ConfidentialAssetId *)
                     ((long)local_1a8.asset._vptr_ConfidentialAssetId + 0x78))->data_).data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        core::ConfidentialValue::operator=
                  (&local_78,
                   (ConfidentialValue *)
                   &((ConfidentialAssetId *)((long)local_1a8.asset._vptr_ConfidentialAssetId + 0xf0)
                    )->data_);
      }
      std::
      vector<cfd::api::UnblindIssuanceOutputs,_std::allocator<cfd::api::UnblindIssuanceOutputs>_>::
      push_back(issuance_outputs,(UnblindIssuanceOutputs *)local_118);
      UnblindIssuanceOutputs::~UnblindIssuanceOutputs((UnblindIssuanceOutputs *)local_118);
      std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
      ~vector((vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> *)
              &local_1a8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ConfidentialTransactionController ElementsTransactionApi::UnblindTransaction(
    const std::string& tx_hex,
    const std::vector<TxOutUnblindKeys>& txout_unblind_keys,
    const std::vector<IssuanceBlindKeys>& issuance_blind_keys,
    std::vector<UnblindOutputs>* blind_outputs,
    std::vector<UnblindIssuanceOutputs>* issuance_outputs) {
  ConfidentialTransactionController ctxc(tx_hex);

  if (!txout_unblind_keys.empty() && blind_outputs != nullptr) {
    UnblindParameter unblind_param;
    for (const auto& txout : txout_unblind_keys) {
      // Unblind TxOut
      const Privkey blinding_key(txout.blinding_key);
      unblind_param = ctxc.UnblindTxOut(txout.index, blinding_key);

      if (!unblind_param.asset.GetHex().empty()) {
        UnblindOutputs output;
        output.index = txout.index;
        output.blind_param.asset = unblind_param.asset;
        output.blind_param.vbf = unblind_param.vbf;
        output.blind_param.abf = unblind_param.abf;
        output.blind_param.value = unblind_param.value;
        blind_outputs->push_back(output);
      }
    }
  }

  if (!issuance_blind_keys.empty() && issuance_outputs != nullptr) {
    for (const auto& issuance : issuance_blind_keys) {
      uint32_t txin_index = ctxc.GetTransaction().GetTxInIndex(
          Txid(issuance.txid), issuance.vout);

      std::vector<UnblindParameter> issuance_param = ctxc.UnblindIssuance(
          txin_index, issuance.issuance_key.asset_key,
          issuance.issuance_key.token_key);

      UnblindIssuanceOutputs output;
      output.txid = issuance.txid;
      output.vout = issuance.vout;
      output.asset = issuance_param[0].asset;
      output.asset_amount = issuance_param[0].value;
      if (issuance_param.size() > 1) {
        output.token = issuance_param[1].asset;
        output.token_amount = issuance_param[1].value;
      }
      issuance_outputs->push_back(output);
    }
  }
  return ctxc;
}